

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O0

int fill_memory_blocks_st(argon2_instance_t *instance)

{
  long in_RDI;
  argon2_position_t position;
  uint32_t l;
  uint32_t s;
  uint32_t r;
  undefined4 local_1c;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0xc); local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < *(uint *)(in_RDI + 0x1c); local_14 = local_14 + 1) {
        local_1c = local_10 & 0xff;
        (**(code **)(in_RDI + 0x38))(in_RDI,CONCAT44(local_14,local_c),local_1c);
      }
    }
  }
  return 0;
}

Assistant:

static int fill_memory_blocks_st(argon2_instance_t *instance) {
	uint32_t r, s, l;

	for (r = 0; r < instance->passes; ++r) {
		for (s = 0; s < ARGON2_SYNC_POINTS; ++s) {
			for (l = 0; l < instance->lanes; ++l) {
				argon2_position_t position = { r, l, (uint8_t)s, 0 };
				//fill the segment using the selected implementation
				instance->impl(instance, position);
			}
		}
	}
	return ARGON2_OK;
}